

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FM.cpp
# Opt level: O1

void __thiscall GainContainer::updateGain(GainContainer *this,uint cell,PartId part,int diff)

{
  const_iterator cVar1;
  pointer pCVar2;
  
  pCVar2 = (this->cell_states_).
           super__Vector_base<GainContainer::CellState,_std::allocator<GainContainer::CellState>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pCVar2[cell].locked == false) {
    pCVar2 = pCVar2 + cell;
    cVar1 = GainBuckets::moveCell
                      ((GainBuckets *)
                       ((long)&(((this->buckets_).
                                 super__Vector_base<GainBuckets,_std::allocator<GainBuckets>_>.
                                 _M_impl.super__Vector_impl_data._M_start)->container_).
                               super__Vector_base<std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               ._M_impl + (ulong)((uint)part * 0x28)),pCVar2->gain,
                       (pCVar2->iter)._M_node,pCVar2->gain + diff);
    (pCVar2->iter)._M_node = cVar1._M_node;
    pCVar2->gain = pCVar2->gain + diff;
  }
  return;
}

Assistant:

void GainContainer::updateGain(unsigned cell, PartId part, int diff) {
  auto &cell_state = cell_states_[cell];
  if (cell_state.locked)
    return;
  cell_state.iter =
      buckets_[part].moveCell(cell_state.gain, cell_state.iter, cell_state.gain + diff);
  cell_state.gain += diff;
}